

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcontainertools_impl.h
# Opt level: O2

void QtPrivate::q_relocate_overlap_n<QAccessibleInterface*(*)(QString_const&,QObject*),long_long>
               (_func_QAccessibleInterface_ptr_QString_ptr_QObject_ptr **first,longlong n,
               _func_QAccessibleInterface_ptr_QString_ptr_QObject_ptr **d_first)

{
  if ((((n != 0) && (d_first != (_func_QAccessibleInterface_ptr_QString_ptr_QObject_ptr **)0x0)) &&
      (first != (_func_QAccessibleInterface_ptr_QString_ptr_QObject_ptr **)0x0)) &&
     (first != d_first)) {
    memmove(d_first,first,n << 3);
    return;
  }
  return;
}

Assistant:

void q_relocate_overlap_n(T *first, N n, T *d_first)
{
    static_assert(std::is_nothrow_destructible_v<T>,
                  "This algorithm requires that T has a non-throwing destructor");

    if (n == N(0) || first == d_first || first == nullptr || d_first == nullptr)
        return;

    if constexpr (QTypeInfo<T>::isRelocatable) {
        std::memmove(static_cast<void *>(d_first), static_cast<const void *>(first), n * sizeof(T));
    } else { // generic version has to be used
        if (d_first < first) {
            q_relocate_overlap_n_left_move(first, n, d_first);
        } else { // first < d_first
            auto rfirst = std::make_reverse_iterator(first + n);
            auto rd_first = std::make_reverse_iterator(d_first + n);
            q_relocate_overlap_n_left_move(rfirst, n, rd_first);
        }
    }
}